

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O1

Function * __thiscall
spv::Builder::makeFunctionEntry
          (Builder *this,Decoration precision,Id returnType,char *name,LinkageType linkType,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *paramTypes,
          vector<std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>,_std::allocator<std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>_>_>
          *decorations,Block **entry)

{
  pointer pvVar1;
  int iVar2;
  Decoration DVar3;
  ulong uVar4;
  Function *pFVar5;
  long lVar6;
  Block *block;
  long lVar7;
  ulong uVar8;
  Id IVar9;
  allocator<char> local_79;
  Function *local_78;
  ulong local_70;
  set<int,_std::less<int>,_std::allocator<int>_> *local_68;
  Id local_5c;
  char *local_58;
  string local_50;
  
  local_70 = CONCAT44(local_70._4_4_,linkType);
  local_58 = name;
  local_5c = makeFunctionType(this,returnType,paramTypes);
  uVar4 = (long)(paramTypes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(paramTypes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                _M_impl.super__Vector_impl_data._M_start;
  local_68 = (set<int,_std::less<int>,_std::allocator<int>_> *)CONCAT44(local_68._4_4_,precision);
  if (uVar4 == 0) {
    uVar8 = 0;
  }
  else {
    uVar8 = (ulong)(this->uniqueId + 1);
    this->uniqueId = (int)(uVar4 >> 2) + this->uniqueId;
  }
  IVar9 = this->uniqueId + 1;
  this->uniqueId = IVar9;
  pFVar5 = (Function *)operator_new(0x108);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,local_58,&local_79);
  local_78 = pFVar5;
  spv::Function::Function
            (pFVar5,IVar9,returnType,local_5c,(Id)uVar8,(LinkageType)local_70,&local_50,
             &this->module);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  pFVar5 = local_78;
  IVar9 = (local_78->functionInstruction).resultId;
  DVar3 = (Decoration)local_68;
  local_70 = uVar8;
  if (IVar9 != 0 && (Decoration)local_68 != DecorationMax) {
    addDecoration(this,IVar9,(Decoration)local_68,-1);
  }
  if (DVar3 == DecorationRelaxedPrecision) {
    pFVar5->reducedPrecisionReturn = true;
  }
  if ((int)((ulong)((long)(decorations->
                          super__Vector_base<std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>,_std::allocator<std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(decorations->
                         super__Vector_base<std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>,_std::allocator<std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555 != 0) {
    local_68 = &local_78->reducedPrecisionParams;
    uVar4 = 0;
    do {
      pvVar1 = (decorations->
               super__Vector_base<std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>,_std::allocator<std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar6 = *(long *)&pvVar1[uVar4].
                        super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>.
                        _M_impl.super__Vector_impl_data;
      if (0 < (int)((ulong)((long)*(pointer *)
                                   ((long)&pvVar1[uVar4].
                                           super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>
                                           ._M_impl.super__Vector_impl_data + 8) - lVar6) >> 2)) {
        iVar2 = (int)local_70;
        lVar7 = 0;
        do {
          addDecoration(this,iVar2 + (int)uVar4,*(Decoration *)(lVar6 + lVar7 * 4),-1);
          if (*(int *)(*(long *)&(decorations->
                                 super__Vector_base<std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>,_std::allocator<std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start[uVar4].
                                 super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>
                                 ._M_impl.super__Vector_impl_data + lVar7 * 4) == 0) {
            local_50._M_dataplus._M_p._0_4_ = (int)uVar4;
            std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
            _M_insert_unique<int>(&local_68->_M_t,(int *)&local_50);
          }
          lVar7 = lVar7 + 1;
          pvVar1 = (decorations->
                   super__Vector_base<std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>,_std::allocator<std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          lVar6 = *(long *)&pvVar1[uVar4].
                            super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>.
                            _M_impl.super__Vector_impl_data;
        } while (lVar7 < (int)((ulong)((long)*(pointer *)
                                              ((long)&pvVar1[uVar4].
                                                                                                            
                                                  super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>
                                                  ._M_impl.super__Vector_impl_data + 8) - lVar6) >>
                              2));
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < (uint)((int)((ulong)((long)(decorations->
                                                super__Vector_base<std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>,_std::allocator<std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>_>_>
                                                )._M_impl.super__Vector_impl_data._M_finish -
                                         (long)(decorations->
                                               super__Vector_base<std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>,_std::allocator<std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>_>_>
                                               )._M_impl.super__Vector_impl_data._M_start) >> 3) *
                           -0x55555555));
  }
  pFVar5 = local_78;
  if (this->emitNonSemanticShaderDebugInfo != false) {
    this->dirtyScopeTracker = true;
  }
  if (entry != (Block **)0x0) {
    block = (Block *)operator_new(0x90);
    IVar9 = this->uniqueId + 1;
    this->uniqueId = IVar9;
    block->_vptr_Block = (_func_int **)&PTR__Block_0093fda8;
    (block->instructions).
    super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (block->instructions).
    super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (block->instructions).
    super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (block->predecessors).super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (block->predecessors).super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (block->predecessors).super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (block->successors).super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (block->successors).super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (block->successors).super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (block->localVariables).
    super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (block->localVariables).
    super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (block->localVariables).
    super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    block->parent = pFVar5;
    (block->currentSourceLoc).super__Optional_base<spv::DebugSourceLocation,_true,_true>._M_payload.
    super__Optional_payload_base<spv::DebugSourceLocation>._M_engaged = false;
    (block->currentDebugScope).super__Optional_base<unsigned_int,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_int>._M_engaged = false;
    block->unreachable = false;
    local_50._M_dataplus._M_p = (pointer)operator_new(0x60);
    *(undefined ***)local_50._M_dataplus._M_p = &PTR__Instruction_0093fd28;
    *(Id *)((long)local_50._M_dataplus._M_p + 8) = IVar9;
    *(undefined8 *)((long)local_50._M_dataplus._M_p + 0xc) = 0xf800000000;
    *(long *)((long)local_50._M_dataplus._M_p + 0x40) = 0;
    *(undefined4 *)((long)local_50._M_dataplus._M_p + 0x48) = 0;
    *(long *)((long)local_50._M_dataplus._M_p + 0x18) = 0;
    *(long *)((long)local_50._M_dataplus._M_p + 0x20) = 0;
    *(long *)((long)local_50._M_dataplus._M_p + 0x28) = 0;
    *(long *)((long)local_50._M_dataplus._M_p + 0x30) = 0;
    *(undefined4 *)((long)local_50._M_dataplus._M_p + 0x38) = 0;
    *(long *)((long)local_50._M_dataplus._M_p + 0x50) = 0;
    *(long *)((long)local_50._M_dataplus._M_p + 0x58) = 0;
    std::
    vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
    ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
              ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
                *)&block->instructions,
               (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_50);
    if ((long *)local_50._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_50._M_dataplus._M_p + 8))();
    }
    pFVar5 = local_78;
    ((block->instructions).
     super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
     ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
     super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
     super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
     super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl)->block = block;
    Module::mapInstruction
              (local_78->parent,
               (block->instructions).
               super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
               super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
               super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
               super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl);
    *entry = block;
    spv::Function::addBlock(pFVar5,block);
    this->buildPoint = *entry;
    this->dirtyLineTracker = true;
    this->dirtyScopeTracker = true;
    if (local_58 != (char *)0x0) {
      addName(this,(pFVar5->functionInstruction).resultId,local_58);
    }
    local_50._M_dataplus._M_p = (pointer)pFVar5;
    std::
    vector<std::unique_ptr<spv::Function,std::default_delete<spv::Function>>,std::allocator<std::unique_ptr<spv::Function,std::default_delete<spv::Function>>>>
    ::emplace_back<std::unique_ptr<spv::Function,std::default_delete<spv::Function>>>
              ((vector<std::unique_ptr<spv::Function,std::default_delete<spv::Function>>,std::allocator<std::unique_ptr<spv::Function,std::default_delete<spv::Function>>>>
                *)&this->functions,
               (unique_ptr<spv::Function,_std::default_delete<spv::Function>_> *)&local_50);
    if ((Function *)local_50._M_dataplus._M_p != (Function *)0x0) {
      (**(code **)(*(long *)local_50._M_dataplus._M_p + 8))();
    }
    return pFVar5;
  }
  __assert_fail("entry != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                ,0x902,
                "Function *spv::Builder::makeFunctionEntry(Decoration, Id, const char *, LinkageType, const std::vector<Id> &, const std::vector<std::vector<Decoration>> &, Block **)"
               );
}

Assistant:

Function* Builder::makeFunctionEntry(Decoration precision, Id returnType, const char* name, LinkageType linkType,
                                     const std::vector<Id>& paramTypes,
                                     const std::vector<std::vector<Decoration>>& decorations, Block** entry)
{
    // Make the function and initial instructions in it
    Id typeId = makeFunctionType(returnType, paramTypes);
    Id firstParamId = paramTypes.size() == 0 ? 0 : getUniqueIds((int)paramTypes.size());
    Id funcId = getUniqueId();
    Function* function = new Function(funcId, returnType, typeId, firstParamId, linkType, name, module);

    // Set up the precisions
    setPrecision(function->getId(), precision);
    function->setReturnPrecision(precision);
    for (unsigned p = 0; p < (unsigned)decorations.size(); ++p) {
        for (int d = 0; d < (int)decorations[p].size(); ++d) {
            addDecoration(firstParamId + p, decorations[p][d]);
            function->addParamPrecision(p, decorations[p][d]);
        }
    }

    // reset last debug scope
    if (emitNonSemanticShaderDebugInfo) {
        dirtyScopeTracker = true;
    }

    // CFG
    assert(entry != nullptr);
    *entry = new Block(getUniqueId(), *function);
    function->addBlock(*entry);
    setBuildPoint(*entry);

    if (name)
        addName(function->getId(), name);

    functions.push_back(std::unique_ptr<Function>(function));

    return function;
}